

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMenu(char *label,bool enabled)

{
  int iVar1;
  ImGuiID IVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImGuiID id;
  ImU32 col;
  ImGuiPopupData *pIVar7;
  uint *puVar8;
  bool bVar9;
  bool bVar10;
  ImGuiWindow *this_00;
  float fVar11;
  ImVec2 IVar12;
  ImVec2 IVar13;
  undefined8 extraout_XMM0_Qb;
  float fVar14;
  float fVar15;
  float fVar16;
  ImRect IVar17;
  bool local_bc;
  ImVec2 ta;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  float local_7c;
  ImGuiWindow *local_78;
  ImGuiWindow **local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  IVar12 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_98._8_8_ = extraout_XMM0_Qb;
  local_98._0_4_ = IVar12.x;
  local_98._4_4_ = IVar12.y;
  bVar4 = IsPopupOpen(id);
  if (((this->Flags & 0x4000000) == 0) &&
     (iVar1 = (pIVar3->BeginPopupStack).Size, iVar1 < (pIVar3->OpenPopupStack).Size)) {
    pIVar7 = ImVector<ImGuiPopupData>::operator[](&pIVar3->OpenPopupStack,iVar1);
    IVar2 = pIVar7->OpenParentId;
    puVar8 = ImVector<unsigned_int>::back(&this->IDStack);
    local_78 = pIVar3->NavWindow;
    local_bc = IVar2 == *puVar8;
    if (local_bc) {
      pIVar3->NavWindow = this;
    }
  }
  else {
    local_78 = pIVar3->NavWindow;
    local_bc = false;
  }
  local_70 = &pIVar3->NavWindow;
  local_a0.x = (this->DC).CursorPos.x;
  fVar11 = (this->DC).CursorPos.y;
  local_58 = ZEXT416((uint)local_a0.x);
  if ((this->DC).LayoutType == 0) {
    local_58 = ZEXT416((uint)((local_a0.x + -1.0) -
                             (float)(int)((pIVar3->Style).ItemSpacing.x * 0.5)));
    local_68 = ZEXT416((uint)(fVar11 - (pIVar3->Style).FramePadding.y));
    local_a0.y = ImGuiWindow::MenuBarHeight(this);
    local_a0.y = local_a0.y + (float)local_68._0_4_;
    local_a0.x = (float)local_58._0_4_;
    fVar11 = (pIVar3->Style).ItemSpacing.x;
    (this->DC).CursorPos.x = (float)(int)(fVar11 * 0.5) + (this->DC).CursorPos.x;
    ta.y = (pIVar3->Style).ItemSpacing.y;
    ta.x = fVar11 + fVar11;
    PushStyleVar(0xd,&ta);
    ta.y = 0.0;
    ta.x = (float)local_98._0_4_;
    bVar5 = Selectable(label,bVar4,(uint)!enabled * 8 + 0x300001,&ta);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
  }
  else {
    local_a0.y = fVar11 - (pIVar3->Style).WindowPadding.y;
    local_68 = ZEXT416((uint)fVar11);
    local_7c = ImGuiMenuColumns::DeclColumns
                         (&(this->DC).MenuColumns,(float)local_98._0_4_,0.0,
                          (float)(int)(pIVar3->FontSize * 1.2));
    IVar12 = GetContentRegionAvail();
    fVar11 = IVar12.x - local_7c;
    local_98 = ZEXT416(~-(uint)(fVar11 <= 0.0) & (uint)fVar11);
    ta.y = 0.0;
    ta.x = local_7c;
    bVar5 = Selectable(label,bVar4,(uint)!enabled * 8 + 0xb00001,&ta);
    col = GetColorU32((uint)!enabled,1.0);
    IVar12.x = (float)local_58._0_4_ +
               pIVar3->FontSize * 0.3 + (float)local_98._0_4_ + (this->DC).MenuColumns.Pos[2];
    IVar12.y = (float)local_68._0_4_ + 0.0;
    RenderArrow(this->DrawList,IVar12,col,1,1.0);
  }
  local_98[0] = bVar5;
  if (enabled) {
    bVar5 = ItemHoverable(&(this->DC).LastItemRect,id);
  }
  else {
    bVar5 = false;
  }
  if (local_bc != false) {
    *local_70 = local_78;
  }
  if ((this->DC).LayoutType == 1) {
    iVar1 = (pIVar3->BeginPopupStack).Size;
    if (iVar1 < (pIVar3->OpenPopupStack).Size) {
      pIVar7 = ImVector<ImGuiPopupData>::operator[](&pIVar3->OpenPopupStack,iVar1);
      if (pIVar7->SourceWindow == this) {
        pIVar7 = ImVector<ImGuiPopupData>::operator[]
                           (&pIVar3->OpenPopupStack,(pIVar3->BeginPopupStack).Size);
        this_00 = pIVar7->Window;
      }
      else {
        this_00 = (ImGuiWindow *)0x0;
      }
    }
    else {
      this_00 = (ImGuiWindow *)0x0;
    }
    bVar6 = true;
    if (((pIVar3->HoveredWindow == this) && (this_00 != (ImGuiWindow *)0x0)) &&
       ((this->Flags & 0x400) == 0)) {
      IVar17 = ImGuiWindow::Rect(this_00);
      local_40.x = IVar17.Max.x;
      IVar12 = (pIVar3->IO).MousePos;
      IVar13 = (pIVar3->IO).MouseDelta;
      fVar14 = IVar12.x - IVar13.x;
      ta.y = IVar12.y - IVar13.y;
      fVar11 = (this_00->Pos).x;
      IVar13.y = IVar17.Min.y;
      if (fVar11 < (this->Pos).x || fVar11 == (this->Pos).x) {
        IVar13.x = local_40.x;
        fVar11 = 0.5;
      }
      else {
        fVar11 = -0.5;
        local_40.x = IVar17.Min.x;
        IVar13 = IVar17.Min;
      }
      fVar15 = ABS(fVar14 - IVar13.x) * 0.3;
      fVar16 = 30.0;
      if (fVar15 <= 30.0) {
        fVar16 = fVar15;
      }
      fVar16 = (float)(-(uint)(fVar15 < 5.0) & 0x40a00000 | ~-(uint)(fVar15 < 5.0) & (uint)fVar16);
      ta.x = fVar11 + fVar14;
      fVar11 = (IVar13.y - fVar16) - ta.y;
      if (fVar11 <= -100.0) {
        fVar11 = -100.0;
      }
      local_38.y = fVar11 + ta.y;
      local_38.x = IVar13.x;
      fVar11 = (IVar17.Max.y + fVar16) - ta.y;
      if (100.0 <= fVar11) {
        fVar11 = 100.0;
      }
      local_40.y = fVar11 + ta.y;
      bVar6 = ImTriangleContainsPoint(&ta,&local_38,&local_40,&(pIVar3->IO).MousePos);
      bVar6 = !bVar6;
    }
    bVar9 = !bVar4;
    if (bVar5 == false && !bVar9) {
      if (pIVar3->HoveredWindow == this) {
        local_bc = (bool)(pIVar3->HoveredIdPreviousFrame != 0 & bVar6 &
                         pIVar3->HoveredIdPreviousFrame != id);
      }
      else {
        local_bc = false;
      }
    }
    else {
      local_bc = false;
    }
    bVar10 = (bool)(local_98[0] & bVar9 & bVar5);
    if (bVar5 == false) {
      bVar6 = bVar10;
    }
    if (bVar4) {
      bVar6 = bVar10;
    }
    if (local_98[0] != 0) {
      bVar6 = bVar10;
    }
    if (pIVar3->NavActivateId == id) {
      local_bc = bVar4;
      bVar6 = bVar9;
    }
    if (((pIVar3->NavId != id) || (pIVar3->NavMoveRequest != true)) || (pIVar3->NavMoveDir != 1))
    goto LAB_001f9e81;
  }
  else {
    if (local_98[0] != 0) {
      local_bc = (bool)(local_bc & local_98[0] & bVar4);
      bVar4 = (bool)(bVar4 ^ local_bc);
      bVar6 = (bool)(local_bc ^ 1);
      goto LAB_001f9e81;
    }
    if ((byte)(bVar4 | local_bc & bVar5 ^ 1U) != 1) {
      bVar6 = true;
      bVar4 = false;
      local_bc = false;
      goto LAB_001f9e81;
    }
    if ((pIVar3->NavId != id) || (pIVar3->NavMoveRequest != true)) {
      bVar6 = false;
      local_bc = false;
      goto LAB_001f9e81;
    }
    local_bc = false;
    if (pIVar3->NavMoveDir != 3) {
      bVar6 = false;
      goto LAB_001f9e81;
    }
  }
  NavMoveRequestCancel();
  bVar6 = true;
LAB_001f9e81:
  if (((!enabled) || (local_bc != false)) && (bVar5 = IsPopupOpen(id), bVar5)) {
    ClosePopupToLevel((pIVar3->BeginPopupStack).Size,true);
  }
  if (((~bVar6 & 1U) == 0 && bVar4 == false) &&
     ((pIVar3->BeginPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
    OpenPopup(label);
    return false;
  }
  if (bVar6 == false) {
    if (bVar4 == false) {
      return false;
    }
  }
  else {
    OpenPopup(label);
  }
  ta.x = 0.0;
  ta.y = 0.0;
  SetNextWindowPos(&local_a0,1,&ta);
  bVar4 = BeginPopupEx(id,(uint)((this->Flags & 0x14000000U) != 0) << 0x18 | 0x10080145);
  return bVar4;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}